

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SSBOStorageTestCase::execute(SSBOStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  GLenum GVar1;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  byte local_201;
  uint local_1dc;
  unsigned_long local_1d8;
  MessageBuilder local_1d0;
  uint local_50;
  uint local_4c;
  uint n_page_1;
  uint n_invocation;
  uint *ssbo_data_ptr;
  uint current_ssbo_offset;
  uint local_30;
  uint local_2c;
  uint n_page;
  uint n_pages;
  uint ssbo_commit_start_offset;
  uint ssbo_commit_size;
  bool is_zigzag_ssbo;
  bool result_local;
  uint n_iteration;
  bool result;
  SSBOStorageTestCase *pSStack_10;
  GLuint sparse_bo_storage_flags_local;
  SSBOStorageTestCase *this_local;
  
  result_local = true;
  n_iteration = sparse_bo_storage_flags;
  pSStack_10 = this;
  (*this->m_gl->useProgram)(this->m_po);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x12a0);
  (*this->m_gl->bindBuffer)(0x90d2,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x12a4);
  (*this->m_gl->bindBufferBase)(0x90d2,0,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x12a8);
  ssbo_commit_size = 0;
  do {
    if (2 < ssbo_commit_size) {
      return (bool)(result_local & 1);
    }
    ssbo_commit_start_offset._3_1_ = 1;
    ssbo_commit_start_offset._2_1_ = ssbo_commit_size == 1;
    n_pages = 0;
    n_page = 0;
    if (ssbo_commit_size < 2) {
      n_pages = this->m_sparse_bo_size_rounded;
      n_page = 0;
      if ((bool)ssbo_commit_start_offset._2_1_) {
        local_2c = n_pages / (uint)this->m_page_size;
        for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 2) {
          (*this->m_gl->bufferPageCommitmentARB)
                    (0x90d2,(ulong)(this->m_page_size * local_30),(long)this->m_page_size,'\x01');
        }
      }
      else {
        (*this->m_gl->bufferPageCommitmentARB)(0x90d2,0,(ulong)n_pages,'\x01');
      }
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferPageCommitmentARB() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x12d2);
    }
    else if (ssbo_commit_size != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized iteration index",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                 ,0x12df);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
    (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBindBuffer() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x12e6);
    (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_sparse_bo_size);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x12ec);
    (*this->m_gl->dispatchCompute)(this->m_sparse_bo_size / this->m_po_local_wg_size,1,1);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDispatchCompute() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x12f3);
    (*this->m_gl->memoryBarrier)(0x200);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glMemoryBarrier() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x12f7);
    (*this->m_gl->bindBuffer)(0x8f36,this->m_sparse_bo);
    (*this->m_gl->bindBuffer)(0x8f37,this->m_result_bo);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBindBuffer() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x12fc);
    (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_sparse_bo_size);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1301);
    ssbo_data_ptr._0_4_ = 0;
    _n_page_1 = (*this->m_gl->mapBuffer)(0x8f37,35000);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1307);
    local_4c = 0;
    while( true ) {
      local_201 = 0;
      if ((uint)ssbo_data_ptr < this->m_sparse_bo_size) {
        local_201 = ssbo_commit_start_offset._3_1_;
      }
      if ((local_201 & 1) == 0) break;
      local_50 = (uint)ssbo_data_ptr / (uint)this->m_page_size;
      if (((((ssbo_commit_start_offset._2_1_ & 1) != 0) && ((local_50 & 1) == 0)) ||
          (((ssbo_commit_start_offset._2_1_ & 1) == 0 &&
           ((n_page <= (uint)ssbo_data_ptr && ((uint)ssbo_data_ptr < n_page + n_pages)))))) &&
         (*(int *)((long)_n_page_1 + (ulong)(local_4c << 2) * 4) != local_4c + 1)) {
        this_01 = tcu::TestContext::getLog(this->m_testCtx);
        tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (&local_1d0,(char (*) [36])"Value written to the SSBO at byte [");
        local_1d8 = (ulong)local_4c << 2;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d8);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [21])"] is invalid. Found:");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c316fc);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (pMVar2,(uint *)((long)_n_page_1 + (ulong)(local_4c << 2) * 4));
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])"], expected:");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c316fc);
        local_1dc = local_4c + 1;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1dc);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d0);
        ssbo_commit_start_offset._3_1_ = 0;
      }
      local_4c = local_4c + 1;
      ssbo_data_ptr._0_4_ = (uint)ssbo_data_ptr + 0x10;
    }
    result_local = (result_local & 1U & ssbo_commit_start_offset._3_1_ & 1) != 0;
    (*this->m_gl->unmapBuffer)(0x8f37);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1325);
    (*this->m_gl->bufferPageCommitmentARB)(0x90d2,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x132b);
    ssbo_commit_size = ssbo_commit_size + 1;
  } while( true );
}

Assistant:

bool SSBOStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	/* Bind the program object */
	m_gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

	/* Set up shader storage buffer bindings */
	m_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, /* index */
						m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase() call failed.");

	/* Run the test in three iterations:
	 *
	 * a) All required pages are committed.
	 * b) Only half of the pages are committed (in a zig-zag layout)
	 * c) None of the pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the shader storage buffer object's memory backing */
		const bool   is_zigzag_ssbo			  = (n_iteration == 1);
		unsigned int ssbo_commit_size		  = 0;
		unsigned int ssbo_commit_start_offset = 0;

		switch (n_iteration)
		{
		case 0:
		case 1:
		{
			ssbo_commit_size		 = m_sparse_bo_size_rounded;
			ssbo_commit_start_offset = 0;

			if (is_zigzag_ssbo)
			{
				const unsigned int n_pages = ssbo_commit_size / m_page_size;

				for (unsigned int n_page = 0; n_page < n_pages; n_page += 2)
				{
					m_gl.bufferPageCommitmentARB(GL_SHADER_STORAGE_BUFFER, m_page_size * n_page, /* offset */
												 m_page_size,									 /* size */
												 GL_TRUE);										 /* commit */
				} /* for (all memory pages) */
			}
			else
			{
				m_gl.bufferPageCommitmentARB(GL_SHADER_STORAGE_BUFFER, 0, /* offset */
											 ssbo_commit_size, GL_TRUE);  /* commit */
			}

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call(s) failed.");

			break;
		}

		case 2:
		{
			/* Use no physical memory backing */
			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized iteration index");
		}
		} /* switch (n_iteration) */

		/* Set up bindings for the copy op */
		m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
		m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

		/* Set up the sparse buffer's data storage */
		m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
							   0,											 /* writeOffset */
							   m_sparse_bo_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		/* Run the compute program */
		DE_ASSERT((m_sparse_bo_size % m_po_local_wg_size) == 0);

		m_gl.dispatchCompute(m_sparse_bo_size / m_po_local_wg_size, 1, /* num_groups_y */
							 1);									   /* num_groups_z */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDispatchCompute() call failed.");

		/* Flush the caches */
		m_gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMemoryBarrier() call failed.");

		/* Copy SSBO's storage to a mappable result BO */
		m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_sparse_bo);
		m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_result_bo);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

		m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
							   0,											 /* writeOffset */
							   m_sparse_bo_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		/* Map the result BO to the process space */
		unsigned int		current_ssbo_offset = 0;
		const unsigned int* ssbo_data_ptr = (const unsigned int*)m_gl.mapBuffer(GL_COPY_WRITE_BUFFER, GL_READ_ONLY);

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

		for (unsigned int n_invocation = 0; current_ssbo_offset < m_sparse_bo_size && result_local; ++n_invocation,
						  current_ssbo_offset = static_cast<unsigned int>(current_ssbo_offset +
																		  (sizeof(int) * 4 /* std140 */)))
		{
			const unsigned int n_page = current_ssbo_offset / m_page_size;

			if ((is_zigzag_ssbo && (n_page % 2) == 0) ||
				(!is_zigzag_ssbo && (current_ssbo_offset >= ssbo_commit_start_offset &&
									 current_ssbo_offset < (ssbo_commit_start_offset + ssbo_commit_size))))
			{
				if (ssbo_data_ptr[n_invocation * 4] != (n_invocation + 1))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Value written to the SSBO at byte "
																   "["
									   << (sizeof(int) * n_invocation) << "]"
																		  " is invalid. Found:"
									   << "[" << ssbo_data_ptr[n_invocation * 4] << "]"
																					", expected:"
									   << "[" << (n_invocation + 1) << "]" << tcu::TestLog::EndMessage;

					result_local = false;
				}
			} /* if (ssbo_data_ptr[n_texel] != 1) */
		}	 /* for (all result values) */

		result &= result_local;

		m_gl.unmapBuffer(GL_COPY_WRITE_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

		/* Remove the physical backing from the sparse buffer  */
		m_gl.bufferPageCommitmentARB(GL_SHADER_STORAGE_BUFFER, 0,		  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}